

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O3

void __thiscall
booster::callback<void_(cppcms::http::context::completion_type)>::callback<async_test::binder>
          (callback<void_(cppcms::http::context::completion_type)> *this,binder *func)

{
  callable_impl<void,_async_test::binder> *this_00;
  binder local_48;
  
  this_00 = (callable_impl<void,_async_test::binder> *)operator_new(0x38);
  local_48.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (func->context).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (func->context).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (local_48.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_48.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_48.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_48.timeout = func->timeout;
  local_48.counter = func->counter;
  local_48._20_4_ = *(undefined4 *)&func->field_0x14;
  local_48.start = func->start;
  callable_impl<void,_async_test::binder>::callable_impl(this_00,&local_48);
  (this->call_ptr).p_ = (callable<void_(cppcms::http::context::completion_type)> *)this_00;
  booster::atomic_counter::inc();
  if (local_48.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.context.
               super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}